

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

int __thiscall
booster::locale::impl_icu::calendar_impl::get_option(calendar_impl *this,calendar_option_type opt)

{
  Calendar *pCVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  UErrorCode err;
  guard l;
  UErrorCode local_24;
  unique_lock<std::mutex> local_20;
  
  if (opt == is_dst) {
    local_20._M_device = &this->lock_;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
    local_20._M_owns = true;
    local_24 = U_ZERO_ERROR;
    cVar2 = (**(code **)(*(long *)(this->calendar_).ptr_ + 0x60))();
    check_and_throw_dt(&local_24);
    bVar4 = cVar2 != '\0';
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  else if ((opt == is_gregorian) && (pCVar1 = (this->calendar_).ptr_, pCVar1 != (Calendar *)0x0)) {
    lVar3 = __dynamic_cast(pCVar1,&icu_70::Calendar::typeinfo,&icu_70::GregorianCalendar::typeinfo,0
                          );
    bVar4 = lVar3 != 0;
  }
  else {
    bVar4 = false;
  }
  return (int)bVar4;
}

Assistant:

virtual int get_option(calendar_option_type opt) const
        {
            switch(opt) {
            case is_gregorian:
                return dynamic_cast<icu::GregorianCalendar const *>(calendar_.get())!=0;
            case is_dst:
                {
                    guard l(lock_);
                    UErrorCode err = U_ZERO_ERROR;
                    bool res = ( calendar_->inDaylightTime(err) != 0 );
                    check_and_throw_dt(err);
                    return res;
                }
            default:
                return 0;
            }
        }